

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

bool __thiscall
Fossilize::FeatureFilter::Impl::subgroup_size_control_is_supported
          (Impl *this,VkPipelineShaderStageCreateInfo *stage)

{
  uint uVar1;
  VkBool32 VVar2;
  VkShaderStageFlagBits VVar3;
  byte bVar4;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *pVVar5;
  
  uVar1 = stage->flags;
  if (3 < uVar1) {
    return false;
  }
  VVar2 = (this->features).subgroup_size_control.subgroupSizeControl;
  if (((byte)uVar1 & VVar2 == 0) == 0) {
    VVar3 = stage->stage;
    bVar4 = 0;
    if (((VVar3 != VK_SHADER_STAGE_COMPUTE_BIT) && (VVar3 != VK_SHADER_STAGE_TASK_BIT_EXT)) &&
       (bVar4 = 0, VVar3 != VK_SHADER_STAGE_MESH_BIT_EXT)) {
      bVar4 = 1;
    }
    if ((uVar1 < 2) ||
       (!(bool)(bVar4 | (this->features).subgroup_size_control.computeFullSubgroups == 0 |
               VVar2 == 0))) {
      pVVar5 = find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfo>
                         ((VkStructureType)stage->pNext,stage);
      if (pVVar5 != (VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *)0x0) {
        if (VVar2 == 0) {
          return false;
        }
        if (((this->props).subgroup_size_control.requiredSubgroupSizeStages & VVar3) == 0) {
          return false;
        }
        if ((this->props).subgroup_size_control.maxSubgroupSize < pVVar5->requiredSubgroupSize) {
          return false;
        }
        if (pVVar5->requiredSubgroupSize < (this->props).subgroup_size_control.minSubgroupSize) {
          return false;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool FeatureFilter::Impl::subgroup_size_control_is_supported(const VkPipelineShaderStageCreateInfo &stage) const
{
	constexpr VkPipelineShaderStageCreateFlags supported_flags =
			VK_PIPELINE_SHADER_STAGE_CREATE_ALLOW_VARYING_SUBGROUP_SIZE_BIT |
			VK_PIPELINE_SHADER_STAGE_CREATE_REQUIRE_FULL_SUBGROUPS_BIT;

	if ((stage.flags & ~supported_flags) != 0)
		return false;

	if ((stage.flags & VK_PIPELINE_SHADER_STAGE_CREATE_ALLOW_VARYING_SUBGROUP_SIZE_BIT_EXT) != 0 &&
	    features.subgroup_size_control.subgroupSizeControl == VK_FALSE)
	{
		return false;
	}

	bool is_compute_like_stage =
			stage.stage == VK_SHADER_STAGE_MESH_BIT_EXT ||
			stage.stage == VK_SHADER_STAGE_TASK_BIT_EXT ||
			stage.stage == VK_SHADER_STAGE_COMPUTE_BIT;

	if ((stage.flags & VK_PIPELINE_SHADER_STAGE_CREATE_REQUIRE_FULL_SUBGROUPS_BIT_EXT) != 0 &&
	    (!is_compute_like_stage ||
	     features.subgroup_size_control.computeFullSubgroups == VK_FALSE ||
	     features.subgroup_size_control.subgroupSizeControl == VK_FALSE))
	{
		return false;
	}

	auto *required = find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT>(
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT,
			stage.pNext);

	if (required)
	{
		if (features.subgroup_size_control.subgroupSizeControl == VK_FALSE ||
		    (props.subgroup_size_control.requiredSubgroupSizeStages & stage.stage) == 0 ||
		    required->requiredSubgroupSize > props.subgroup_size_control.maxSubgroupSize ||
		    required->requiredSubgroupSize < props.subgroup_size_control.minSubgroupSize)
		{
			return false;
		}
	}

	return true;
}